

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O3

bool dg::llvmutils::callIsCompatible(Function *F,CallInst *CI,CallCompatibility policy)

{
  int iVar1;
  long lVar2;
  char cVar3;
  bool bVar4;
  op_iterator pUVar5;
  long *plVar6;
  CallInst *pCVar7;
  ulong uVar8;
  ulong uVar9;
  long *plVar10;
  long *plVar11;
  
  pUVar5 = llvm::CallBase::arg_end((CallBase *)CI);
  iVar1 = *(int *)(CI + 0x14);
  if (policy == MATCHING_ARGS) {
LAB_00117fb1:
    if (((byte)F[0x12] & 1) == 0) {
      plVar10 = *(long **)(F + 0x58);
      plVar6 = plVar10;
    }
    else {
      llvm::Function::BuildLazyArguments();
      plVar10 = *(long **)(F + 0x58);
      plVar6 = plVar10;
      if (((byte)F[0x12] & 1) != 0) {
        llvm::Function::BuildLazyArguments();
        plVar6 = *(long **)(F + 0x58);
      }
    }
    bVar4 = true;
    uVar8 = (ulong)(pUVar5 + ((ulong)(uint)(iVar1 << 5) - (long)CI)) >> 5 & 0xffffffff;
    if ((uVar8 != 0) && (lVar2 = *(long *)(F + 0x60), plVar10 != plVar6 + lVar2 * 5)) {
      uVar9 = 1;
      pCVar7 = CI;
      do {
        plVar11 = plVar10 + 5;
        if ((((*(uint *)((Type *)**(undefined8 **)
                                   (pCVar7 + -(ulong)(uint)(*(int *)(CI + 0x14) << 5)) + 8) & 0xfd)
              != 0xd) || ((*(uint *)(*plVar10 + 8) & 0xfd) != 0xd)) &&
           (cVar3 = llvm::Type::canLosslesslyBitCastTo
                              ((Type *)**(undefined8 **)
                                         (pCVar7 + -(ulong)(uint)(*(int *)(CI + 0x14) << 5))),
           cVar3 == '\0')) goto LAB_0011809a;
        if (uVar8 <= uVar9) break;
        pCVar7 = pCVar7 + 0x20;
        uVar9 = uVar9 + 1;
        plVar10 = plVar11;
      } while (plVar11 != plVar6 + lVar2 * 5);
      bVar4 = true;
    }
  }
  else {
    uVar8 = *(ulong *)(F + 0x60);
    uVar9 = (ulong)(pUVar5 + ((ulong)(uint)(iVar1 << 5) - (long)CI)) >> 5 & 0xffffffff;
    if (*(uint *)(*(long *)(F + 0x18) + 8) < 0x100) {
      if (uVar8 != uVar9) {
        if (policy == STRICT) {
          return false;
        }
        if (uVar9 < uVar8) {
          return false;
        }
      }
LAB_00117f96:
      cVar3 = llvm::Type::canLosslesslyBitCastTo
                        ((Type *)**(undefined8 **)(*(long *)(F + 0x18) + 0x10));
      if ((cVar3 != '\0') ||
         (((*(uint *)(**(long **)(*(long *)(F + 0x18) + 0x10) + 8) & 0xfd) == 0xd &&
          ((*(uint *)(*(long *)CI + 8) & 0xfd) == 0xd)))) goto LAB_00117fb1;
    }
    else if (uVar8 <= uVar9) goto LAB_00117f96;
LAB_0011809a:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

inline bool
callIsCompatible(const Function *F, const CallInst *CI,
                 CallCompatibility policy = CallCompatibility::LOOSE) {
    using namespace llvm;

    auto ci_arg_size = getNumArgOperands(CI);
    if (policy != CallCompatibility::MATCHING_ARGS) {
        if (F->isVarArg()) {
            if (F->arg_size() > ci_arg_size) {
                return false;
            }
        } else if (F->arg_size() != ci_arg_size) {
            if (policy == CallCompatibility::STRICT ||
                F->arg_size() > ci_arg_size) {
                // too few arguments
                return false;
            }
        }

        if (!F->getReturnType()->canLosslesslyBitCastTo(CI->getType())) {
            // it showed up that the loosless bitcast is too strict
            // alternative since we can use the constexpr castings
            if (!(isPointerOrIntegerTy(F->getReturnType()) &&
                  isPointerOrIntegerTy(CI->getType()))) {
                return false;
            }
        }
    }

    size_t idx = 0;
    for (auto A = F->arg_begin(), E = F->arg_end(); idx < ci_arg_size && A != E;
         ++A, ++idx) {
        Type *CTy = CI->getArgOperand(idx)->getType();
        Type *ATy = A->getType();

        if (!(isPointerOrIntegerTy(CTy) && isPointerOrIntegerTy(ATy)))
            if (!CTy->canLosslesslyBitCastTo(ATy)) {
                return false;
            }
    }

    return true;
}